

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall
ExprTest_EqualBinaryLogicalExpr_Test::TestBody(ExprTest_EqualBinaryLogicalExpr_Test *this)

{
  ExprFactory *this_00;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> lhs;
  bool bVar1;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
  BVar2;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
  BVar3;
  char *in_R9;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  string local_50;
  AssertionResult gtest_ar_;
  
  this_00 = &(this->super_ExprTest).factory_;
  BVar2 = mp::BasicExprFactory<std::allocator<char>>::
          MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,FIRST_BINARY_LOGICAL,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     (this->super_ExprTest).l0.super_ExprBase.impl_,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     (this->super_ExprTest).l1.super_ExprBase.impl_);
  BVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,FIRST_BINARY_LOGICAL,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     (this->super_ExprTest).l0.super_ExprBase.impl_,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     (this->super_ExprTest).l1.super_ExprBase.impl_);
  gtest_ar_.success_ =
       mp::Equal((Expr)BVar2.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.super_ExprBase.
                       impl_,
                 (Expr)BVar3.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.super_ExprBase.
                       impl_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,(internal *)&gtest_ar_,
               (AssertionResult *)
               "Equal(factory_.MakeBinaryLogical(expr::OR, l0, l1), factory_.MakeBinaryLogical(expr::OR, l0, l1))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x363
               ,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  BVar2 = mp::BasicExprFactory<std::allocator<char>>::
          MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,FIRST_BINARY_LOGICAL,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     (this->super_ExprTest).l0.super_ExprBase.impl_,
                     (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
                     (this->super_ExprTest).l1.super_ExprBase.impl_);
  lhs.super_ExprBase.impl_ = (ExprBase)(this->super_ExprTest).l0.super_ExprBase.impl_;
  BVar3 = mp::BasicExprFactory<std::allocator<char>>::
          MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,FIRST_BINARY_LOGICAL,lhs,lhs)
  ;
  bVar1 = mp::Equal((Expr)BVar2.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.
                          super_ExprBase.impl_,
                    (Expr)BVar3.super_BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52>.
                          super_ExprBase.impl_);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,(internal *)&gtest_ar_,
               (AssertionResult *)
               "Equal(factory_.MakeBinaryLogical(expr::OR, l0, l1), factory_.MakeBinaryLogical(expr::OR, l0, l0))"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x365
               ,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(ExprTest, EqualBinaryLogicalExpr) {
  EXPECT_TRUE(Equal(factory_.MakeBinaryLogical(expr::OR, l0, l1),
                    factory_.MakeBinaryLogical(expr::OR, l0, l1)));
  EXPECT_FALSE(Equal(factory_.MakeBinaryLogical(expr::OR, l0, l1),
                     factory_.MakeBinaryLogical(expr::OR, l0, l0)));
}